

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

bool __thiscall cmServerBase::Serve(cmServerBase *this,string *errorMessage)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uv_thread_t uVar4;
  reference this_00;
  pointer pcVar5;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *__range1;
  shared_lock<cm::shared_mutex> lock;
  uv_thread_t blank_thread_t;
  string *errorMessage_local;
  cmServerBase *this_local;
  
  lock._mutex = (shared_mutex *)0x0;
  iVar2 = uv_thread_equal((uv_thread_t *)&lock,&this->ServeThreadId);
  if (iVar2 == 0) {
    __assert_fail("uv_thread_equal(&blank_thread_t, &ServeThreadId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                  ,0x1bb,"virtual bool cmServerBase::Serve(std::string *)");
  }
  uVar4 = uv_thread_self();
  this->ServeThreadId = uVar4;
  std::__cxx11::string::clear();
  ::cm::uv_async_ptr::init(&this->ShutdownSignal,(EVP_PKEY_CTX *)&this->Loop);
  ::cm::uv_signal_ptr::init(&this->SIGINTHandler,(EVP_PKEY_CTX *)&this->Loop);
  ::cm::uv_signal_ptr::init(&this->SIGHUPHandler,(EVP_PKEY_CTX *)&this->Loop);
  ::cm::uv_signal_ptr::start(&this->SIGINTHandler,on_signal,2);
  ::cm::uv_signal_ptr::start(&this->SIGHUPHandler,on_signal,1);
  (*this->_vptr_cmServerBase[7])();
  ::cm::shared_lock<cm::shared_mutex>::shared_lock
            ((shared_lock<cm::shared_mutex> *)&__range1,&this->ConnectionsMutex);
  __end1 = std::
           vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ::begin(&this->Connections);
  connection = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
               std::
               vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
               ::end(&this->Connections);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
                                *)&connection);
    if (!bVar1) {
      bVar1 = false;
LAB_005b3e9f:
      ::cm::shared_lock<cm::shared_mutex>::~shared_lock((shared_lock<cm::shared_mutex> *)&__range1);
      if (!bVar1) {
        iVar2 = uv_run(&this->Loop,UV_RUN_DEFAULT);
        if (iVar2 != 0) {
          __assert_fail("false && \"Event loop stopped in unclean state.\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                        ,0x1d8,"virtual bool cmServerBase::Serve(std::string *)");
        }
        this_local._7_1_ = 1;
      }
      return (bool)(this_local._7_1_ & 1);
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
              ::operator*(&__end1);
    pcVar5 = std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>::operator->(this_00);
    uVar3 = (*pcVar5->_vptr_cmConnection[7])();
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = 0;
      bVar1 = true;
      goto LAB_005b3e9f;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmServerBase::Serve(std::string* errorMessage)
{
#ifndef NDEBUG
  uv_thread_t blank_thread_t = {};
  assert(uv_thread_equal(&blank_thread_t, &ServeThreadId));
  ServeThreadId = uv_thread_self();
#endif

  errorMessage->clear();

  ShutdownSignal.init(Loop, __shutdownThread, this);

  SIGINTHandler.init(Loop, this);
  SIGHUPHandler.init(Loop, this);

  SIGINTHandler.start(&on_signal, SIGINT);
  SIGHUPHandler.start(&on_signal, SIGHUP);

  OnServeStart();

  {
    cm::shared_lock<cm::shared_mutex> lock(ConnectionsMutex);
    for (auto& connection : Connections) {
      if (!connection->OnServeStart(errorMessage)) {
        return false;
      }
    }
  }

  if (uv_run(&Loop, UV_RUN_DEFAULT) != 0) {
    // It is important we don't ever let the event loop exit with open handles
    // at best this is a memory leak, but it can also introduce race conditions
    // which can hang the program.
    assert(false && "Event loop stopped in unclean state.");

    *errorMessage = "Internal Error: Event loop stopped in unclean state.";
    return false;
  }

  return true;
}